

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O0

QpVector * __thiscall
Basis::Ztprod(Basis *this,QpVector *rhs,QpVector *target,bool buffer,HighsInt q)

{
  value_type vVar1;
  int iVar2;
  QpVector *pQVar3;
  reference pvVar4;
  reference pvVar5;
  QpVector *in_RDX;
  long in_RDI;
  HighsInt idx;
  HighsInt nonactive;
  size_t i;
  HighsInt in_stack_00000088;
  bool in_stack_0000008f;
  QpVector *in_stack_00000090;
  QpVector *in_stack_00000098;
  Basis *in_stack_000000a0;
  QpVector *in_stack_ffffffffffffffc0;
  QpVector *this_00;
  QpVector *local_28;
  
  ftran(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_0000008f,in_stack_00000088);
  QpVector::reset(in_stack_ffffffffffffffc0);
  local_28 = (QpVector *)0x0;
  while( true ) {
    this_00 = local_28;
    pQVar3 = (QpVector *)
             std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x910));
    if (pQVar3 <= this_00) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x910),(size_type)local_28);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x970),(long)*pvVar4);
    iVar2 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDX->index,(size_type)local_28);
    *pvVar4 = (value_type)local_28;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd0),(long)iVar2);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDX->value,(size_type)local_28);
    *pvVar5 = vVar1;
    local_28 = (QpVector *)((long)&local_28->num_nz + 1);
  }
  QpVector::resparsify(this_00);
  return in_RDX;
}

Assistant:

QpVector& Basis::Ztprod(const QpVector& rhs, QpVector& target, bool buffer,
                        HighsInt q) {
  ftran(rhs, Ztprod_res, buffer, q);

  target.reset();
  for (size_t i = 0; i < non_active_constraint_index.size(); i++) {
    HighsInt nonactive = non_active_constraint_index[i];
    HighsInt idx = constraintindexinbasisfactor[nonactive];
    target.index[i] = static_cast<HighsInt>(i);
    target.value[i] = Ztprod_res.value[idx];
  }
  target.resparsify();
  return target;
}